

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::time_internal::cctz::(anonymous_namespace)::AndroidZoneInfoSource::
Version_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  AndroidZoneInfoSource *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string Version() const override { return version_; }